

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O3

word Extra_Truth6SwapAdjacent(word t,int iVar)

{
  byte bVar1;
  
  if (iVar < 5) {
    bVar1 = (byte)(1 << ((byte)iVar & 0x1f));
    return (t & Extra_Truth6SwapAdjacent::PMasks[iVar][2]) >> (bVar1 & 0x3f) |
           (Extra_Truth6SwapAdjacent::PMasks[iVar][1] & t) << (bVar1 & 0x3f) |
           Extra_Truth6SwapAdjacent::PMasks[iVar][0] & t;
  }
  __assert_fail("iVar < 5",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast6.c"
                ,0x53,"word Extra_Truth6SwapAdjacent(word, int)");
}

Assistant:

word Extra_Truth6SwapAdjacent( word t, int iVar )
{
    // variable swapping code
    static word PMasks[5][3] = {
        { ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) },
        { ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030) },
        { ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00) },
        { ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) },
        { ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000) }
    };
    assert( iVar < 5 );
    return (t & PMasks[iVar][0]) | ((t & PMasks[iVar][1]) << (1 << iVar)) | ((t & PMasks[iVar][2]) >> (1 << iVar));
}